

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O0

void Diligent::VerifyEngineGLCreateInfo(EngineGLCreateInfo *EngineCI)

{
  EngineGLCreateInfo *EngineCI_local;
  
  if ((EngineCI[0x21] == (EngineGLCreateInfo)0x1) && (EngineCI[0x20] == (EngineGLCreateInfo)0x0)) {
    LogError<true,char[217]>
              (false,"VerifyEngineGLCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
               ,0x90,(char (*) [217])
                     "Requested state for ShaderResourceQueries feature is ENABLED, while requested state for SeparablePrograms feature is DISABLED. ShaderResourceQueries may only be enabled when SeparablePrograms feature is also enabled."
              );
  }
  if ((EngineCI[0x25] == (EngineGLCreateInfo)0x1) && (EngineCI[0x20] == (EngineGLCreateInfo)0x0)) {
    LogError<true,char[205]>
              (false,"VerifyEngineGLCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
               ,0x97,(char (*) [205])
                     "Requested state for GeometryShaders feature is ENABLED, while requested state for SeparablePrograms feature is DISABLED. GeometryShaders may only be enabled when SeparablePrograms feature is also enabled."
              );
  }
  if ((EngineCI[0x26] == (EngineGLCreateInfo)0x1) && (EngineCI[0x20] == (EngineGLCreateInfo)0x0)) {
    LogError<true,char[199]>
              (false,"VerifyEngineGLCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
               ,0x9e,(char (*) [199])
                     "Requested state for Tessellation feature is ENABLED, while requested state for SeparablePrograms feature is DISABLED. Tessellation may only be enabled when SeparablePrograms feature is also enabled."
              );
  }
  return;
}

Assistant:

static void VerifyEngineGLCreateInfo(const EngineGLCreateInfo& EngineCI) noexcept(false)
{
    if (EngineCI.Features.ShaderResourceQueries == DEVICE_FEATURE_STATE_ENABLED &&
        EngineCI.Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
    {
        LOG_ERROR_AND_THROW("Requested state for ShaderResourceQueries feature is ENABLED, while requested state for SeparablePrograms feature is DISABLED. "
                            "ShaderResourceQueries may only be enabled when SeparablePrograms feature is also enabled.");
    }

    if (EngineCI.Features.GeometryShaders == DEVICE_FEATURE_STATE_ENABLED &&
        EngineCI.Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
    {
        LOG_ERROR_AND_THROW("Requested state for GeometryShaders feature is ENABLED, while requested state for SeparablePrograms feature is DISABLED. "
                            "GeometryShaders may only be enabled when SeparablePrograms feature is also enabled.");
    }

    if (EngineCI.Features.Tessellation == DEVICE_FEATURE_STATE_ENABLED &&
        EngineCI.Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
    {
        LOG_ERROR_AND_THROW("Requested state for Tessellation feature is ENABLED, while requested state for SeparablePrograms feature is DISABLED. "
                            "Tessellation may only be enabled when SeparablePrograms feature is also enabled.");
    }
}